

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

bool slang::ast::checkSignaturesMatch(SubroutineSymbol *a,SubroutineSymbol *b)

{
  pointer ppFVar1;
  size_t sVar2;
  pointer ppFVar3;
  bool bVar4;
  bool bVar5;
  Type *pTVar6;
  Type *pTVar7;
  FormalArgumentSymbol *pFVar8;
  FormalArgumentSymbol *pFVar9;
  long lVar10;
  
  if ((a->subroutineKind == b->subroutineKind) && ((a->flags).m_bits == (b->flags).m_bits)) {
    pTVar6 = DeclaredType::getType(&a->declaredReturnType);
    pTVar7 = DeclaredType::getType(&b->declaredReturnType);
    bVar4 = Type::isEquivalent(pTVar6,pTVar7);
    if (bVar4) {
      if ((a->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&a->super_Scope);
      }
      ppFVar1 = (a->arguments)._M_ptr;
      sVar2 = (a->arguments)._M_extent._M_extent_value;
      if ((b->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&b->super_Scope);
      }
      if (sVar2 == (b->arguments)._M_extent._M_extent_value) {
        bVar4 = sVar2 == 0;
        if (bVar4) {
          return bVar4;
        }
        ppFVar3 = (b->arguments)._M_ptr;
        pFVar8 = *ppFVar1;
        pFVar9 = *ppFVar3;
        pTVar6 = DeclaredType::getType
                           (&(pFVar8->super_VariableSymbol).super_ValueSymbol.declaredType);
        pTVar7 = DeclaredType::getType
                           (&(pFVar9->super_VariableSymbol).super_ValueSymbol.declaredType);
        bVar5 = Type::isEquivalent(pTVar6,pTVar7);
        if (!bVar5) {
          return bVar4;
        }
        lVar10 = 8;
        while( true ) {
          if (pFVar8->direction != pFVar9->direction) {
            return bVar4;
          }
          bVar4 = sVar2 << 3 == lVar10;
          if (bVar4) break;
          pFVar8 = *(FormalArgumentSymbol **)((long)ppFVar1 + lVar10);
          pFVar9 = *(FormalArgumentSymbol **)((long)ppFVar3 + lVar10);
          pTVar6 = DeclaredType::getType
                             (&(pFVar8->super_VariableSymbol).super_ValueSymbol.declaredType);
          pTVar7 = DeclaredType::getType
                             (&(pFVar9->super_VariableSymbol).super_ValueSymbol.declaredType);
          bVar5 = Type::isEquivalent(pTVar6,pTVar7);
          lVar10 = lVar10 + 8;
          if (!bVar5) {
            return bVar4;
          }
        }
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

static bool checkSignaturesMatch(const SubroutineSymbol& a, const SubroutineSymbol& b) {
    if (a.subroutineKind != b.subroutineKind || a.flags != b.flags)
        return false;

    if (!a.getReturnType().isEquivalent(b.getReturnType()))
        return false;

    auto aargs = a.getArguments();
    auto bargs = b.getArguments();
    if (aargs.size() != bargs.size())
        return false;

    for (auto ai = aargs.begin(), bi = bargs.begin(); ai != aargs.end(); ai++, bi++) {
        auto aa = *ai;
        auto bb = *bi;
        if (!aa->getType().isEquivalent(bb->getType()))
            return false;
        if (aa->direction != bb->direction)
            return false;
    }

    return true;
}